

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS
ref_layer_prism_insert_hair
          (REF_GRID ref_grid,REF_DICT ref_dict_bcs,REF_BOOL *active,REF_INT *off_node)

{
  REF_INT key;
  REF_NODE ref_node_00;
  REF_CELL pRVar1;
  uint uVar2;
  REF_BOOL RVar3;
  double local_190;
  REF_INT local_188;
  REF_INT local_184;
  int local_180;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rsb_5;
  REF_STATUS ref_private_macro_code_rsb_4;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rsb_3;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rsb_2;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_DBL param [2];
  REF_GEOM ref_geom;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_BOOL prevent_constrain;
  REF_INT constraining_faceid;
  REF_INT faceid;
  REF_DBL normal [3];
  double local_c8;
  REF_DBL tri_normal [3];
  REF_INT local_a8;
  REF_BOOL constrained;
  REF_INT bc;
  REF_INT new_node;
  REF_GLOB global;
  REF_DBL h;
  REF_DBL ratio;
  REF_DBL m [6];
  REF_CAVITY ref_cavity;
  int local_48;
  REF_INT cell;
  REF_INT item;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT *off_node_local;
  REF_BOOL *active_local;
  REF_DICT ref_dict_bcs_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  pRVar1 = ref_grid->cell[3];
  cell = 0;
  do {
    if (ref_node_00->max <= cell) {
      return 0;
    }
    if ((((-1 < cell) && (cell < ref_node_00->max)) && (-1 < ref_node_00->global[cell])) &&
       ((ref_node_00->ref_mpi->id == ref_node_00->part[cell] && (active[cell] != 0)))) {
      _constraining_faceid = 0.0;
      normal[0] = 0.0;
      normal[1] = 0.0;
      tri_normal[2]._4_4_ = 0;
      ref_private_macro_code_rxs = -1;
      if ((cell < 0) || (pRVar1->ref_adj->nnode <= cell)) {
        local_180 = -1;
      }
      else {
        local_180 = pRVar1->ref_adj->first[cell];
      }
      local_48 = local_180;
      if (local_180 == -1) {
        local_184 = -1;
      }
      else {
        local_184 = pRVar1->ref_adj->item[local_180].ref;
      }
      ref_cavity._4_4_ = local_184;
      while (local_48 != -1) {
        key = pRVar1->c2n[pRVar1->node_per + pRVar1->size_per * ref_cavity._4_4_];
        uVar2 = ref_dict_value(ref_dict_bcs,key,&local_a8);
        if ((uVar2 != 0) && (uVar2 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x3f7,"ref_layer_prism_insert_hair",(ulong)uVar2,"bc");
          return uVar2;
        }
        RVar3 = ref_phys_wall_distance_bc(local_a8);
        if (RVar3 == 0) {
          tri_normal[2]._4_4_ = 1;
          if ((ref_private_macro_code_rxs != -1) && (ref_private_macro_code_rxs != key)) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x402,"ref_layer_prism_insert_hair","multiple face constraints");
            return 1;
          }
        }
        else {
          uVar2 = ref_node_tri_normal(ref_node_00,pRVar1->c2n + pRVar1->size_per * ref_cavity._4_4_,
                                      &local_c8);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x3fb,"ref_layer_prism_insert_hair",(ulong)uVar2,"tri norm");
            return uVar2;
          }
          _constraining_faceid = local_c8 + _constraining_faceid;
          normal[0] = tri_normal[0] + normal[0];
          normal[1] = tri_normal[1] + normal[1];
          key = ref_private_macro_code_rxs;
        }
        ref_private_macro_code_rxs = key;
        local_48 = pRVar1->ref_adj->item[local_48].next;
        if (local_48 == -1) {
          local_188 = -1;
        }
        else {
          local_188 = pRVar1->ref_adj->item[local_48].ref;
        }
        ref_cavity._4_4_ = local_188;
      }
      uVar2 = ref_math_normalize((REF_DBL *)&constraining_faceid);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x406,"ref_layer_prism_insert_hair",(ulong)uVar2,"norm");
        return uVar2;
      }
      uVar2 = ref_node_metric_get(ref_node_00,cell,&ratio);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x407,"ref_layer_prism_insert_hair",(ulong)uVar2,"get");
        return uVar2;
      }
      h = normal[1] * (m[4] * normal[1] + m[1] * _constraining_faceid + m[3] * normal[0]) +
          _constraining_faceid *
          (m[1] * normal[1] + ratio * _constraining_faceid + m[0] * normal[0]) +
          normal[0] * (m[3] * normal[1] + m[0] * _constraining_faceid + m[2] * normal[0]);
      if (h <= 0.0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x409,"ref_layer_prism_insert_hair","ratio not positive");
        return 1;
      }
      h = sqrt(h);
      if (h * 1e+20 <= 0.0) {
        local_190 = -(h * 1e+20);
      }
      else {
        local_190 = h * 1e+20;
      }
      if (local_190 <= 1.0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x40b,"ref_layer_prism_insert_hair","1/ratio is inf 1/0");
        return 1;
      }
      global = (REF_GLOB)(1.0 / h);
      uVar2 = ref_node_next_global(ref_node_00,(REF_GLOB *)&bc);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x40d,"ref_layer_prism_insert_hair",(ulong)uVar2,"next global");
        return uVar2;
      }
      uVar2 = ref_node_add(ref_node_00,_bc,&constrained);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x40e,"ref_layer_prism_insert_hair",(ulong)uVar2,"add");
        return uVar2;
      }
      off_node[cell] = constrained;
      ref_node_00->real[constrained * 0xf] =
           (double)global * _constraining_faceid + ref_node_00->real[cell * 0xf];
      ref_node_00->real[constrained * 0xf + 1] =
           (double)global * normal[0] + ref_node_00->real[cell * 0xf + 1];
      ref_node_00->real[constrained * 0xf + 2] =
           (double)global * normal[1] + ref_node_00->real[cell * 0xf + 2];
      if (tri_normal[2]._4_4_ == 0) {
        uVar2 = ref_cavity_create((REF_CAVITY *)(m + 5));
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x457,"ref_layer_prism_insert_hair",(ulong)uVar2,"cav create");
          return uVar2;
        }
        uVar2 = ref_cavity_form_insert_tet((REF_CAVITY)m[5],ref_grid,constrained,cell,-1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x45a,"ref_layer_prism_insert_hair",(ulong)uVar2,"ball");
          return uVar2;
        }
        uVar2 = ref_cavity_enlarge_combined((REF_CAVITY)m[5]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x45e,"ref_layer_prism_insert_hair",(ulong)uVar2,"enlarge");
          ref_cavity_tec((REF_CAVITY)m[5],"cav-fail.tec");
          ref_export_by_extension(ref_grid,"mesh-fail.tec");
          return uVar2;
        }
        uVar2 = ref_cavity_replace((REF_CAVITY)m[5]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x462,"ref_layer_prism_insert_hair",(ulong)uVar2,"cav replace");
          ref_cavity_tec((REF_CAVITY)m[5],"ref_layer_prism_cavity.tec");
          ref_export_by_extension(ref_grid,"ref_layer_prism_mesh.tec");
          return uVar2;
        }
        uVar2 = ref_cavity_free((REF_CAVITY)m[5]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x463,"ref_layer_prism_insert_hair",(ulong)uVar2,"cav free");
          return uVar2;
        }
      }
      else {
        param[1] = (REF_DBL)ref_grid->geom;
        uVar2 = ref_geom_tuv((REF_GEOM)param[1],cell,2,ref_private_macro_code_rxs,
                             (REF_DBL *)&ref_private_macro_code_rss_6);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x41b,"ref_layer_prism_insert_hair",(ulong)uVar2,"base param");
          return uVar2;
        }
        uVar2 = ref_egads_inverse_eval
                          ((REF_GEOM)param[1],2,ref_private_macro_code_rxs,
                           ref_node_00->real + constrained * 0xf,
                           (REF_DBL *)&ref_private_macro_code_rss_6);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x41e,"ref_layer_prism_insert_hair",(ulong)uVar2,"inv eval");
          return uVar2;
        }
        uVar2 = ref_egads_eval_at((REF_GEOM)param[1],2,ref_private_macro_code_rxs,
                                  (REF_DBL *)&ref_private_macro_code_rss_6,
                                  ref_node_00->real + constrained * 0xf,(REF_DBL *)0x0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x422,"ref_layer_prism_insert_hair",(ulong)uVar2,"inv eval");
          return uVar2;
        }
        uVar2 = ref_geom_add((REF_GEOM)param[1],constrained,2,ref_private_macro_code_rxs,
                             (REF_DBL *)&ref_private_macro_code_rss_6);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x425,"ref_layer_prism_insert_hair",(ulong)uVar2,"add param");
          return uVar2;
        }
        off_node[cell] = -1;
        uVar2 = ref_geom_remove_all((REF_GEOM)param[1],constrained);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x428,"ref_layer_prism_insert_hair",(ulong)uVar2,"rm geom");
          return uVar2;
        }
        uVar2 = ref_node_remove(ref_node_00,constrained);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x429,"ref_layer_prism_insert_hair",(ulong)uVar2,"rm node");
          return uVar2;
        }
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

static REF_FCN REF_STATUS ref_layer_prism_insert_hair(REF_GRID ref_grid,
                                                      REF_DICT ref_dict_bcs,
                                                      REF_BOOL *active,
                                                      REF_INT *off_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);

  REF_INT node;
  REF_INT item, cell;
  REF_CAVITY ref_cavity;
  REF_DBL m[6], ratio, h;
  REF_GLOB global;
  REF_INT new_node;
  REF_INT bc;
  REF_BOOL constrained;
  REF_DBL tri_normal[3], normal[3];
  REF_INT faceid, constraining_faceid;
  REF_BOOL prevent_constrain = REF_TRUE;

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node) && active[node]) {
      normal[0] = 0.0;
      normal[1] = 0.0;
      normal[2] = 0.0;
      constrained = REF_FALSE;
      constraining_faceid = REF_EMPTY;
      each_ref_cell_having_node(ref_cell, node, item, cell) {
        faceid = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
        RXS(ref_dict_value(ref_dict_bcs, faceid, &bc), REF_NOT_FOUND, "bc");
        if (ref_phys_wall_distance_bc(bc)) {
          RSS(ref_node_tri_normal(ref_node, &(ref_cell_c2n(ref_cell, 0, cell)),
                                  tri_normal),
              "tri norm");
          normal[0] += tri_normal[0];
          normal[1] += tri_normal[1];
          normal[2] += tri_normal[2];
        } else {
          constrained = REF_TRUE;
          RAS(constraining_faceid == REF_EMPTY || constraining_faceid == faceid,
              "multiple face constraints");
          constraining_faceid = faceid;
        }
      }
      RSS(ref_math_normalize(normal), "norm");
      RSS(ref_node_metric_get(ref_node, node, m), "get");
      ratio = ref_matrix_vt_m_v(m, normal);
      RAS(ratio > 0.0, "ratio not positive");
      ratio = sqrt(ratio);
      RAS(ref_math_divisible(1.0, ratio), "1/ratio is inf 1/0");
      h = 1.0 / ratio;
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &new_node), "add");
      off_node[node] = new_node;
      ref_node_xyz(ref_node, 0, new_node) =
          ref_node_xyz(ref_node, 0, node) + h * normal[0];
      ref_node_xyz(ref_node, 1, new_node) =
          ref_node_xyz(ref_node, 1, node) + h * normal[1];
      ref_node_xyz(ref_node, 2, new_node) =
          ref_node_xyz(ref_node, 2, node) + h * normal[2];
      if (constrained) {
        REF_GEOM ref_geom = ref_grid_geom(ref_grid);
        REF_DBL param[2];
        RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, constraining_faceid,
                         param),
            "base param");
        RSS(ref_egads_inverse_eval(ref_geom, REF_GEOM_FACE, constraining_faceid,
                                   ref_node_xyz_ptr(ref_node, new_node), param),
            "inv eval");
        RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, constraining_faceid,
                              param, ref_node_xyz_ptr(ref_node, new_node),
                              NULL),
            "inv eval");
        RSS(ref_geom_add(ref_geom, new_node, REF_GEOM_FACE, constraining_faceid,
                         param),
            "add param");
        if (prevent_constrain) {
          off_node[node] = REF_EMPTY;
          RSS(ref_geom_remove_all(ref_geom, new_node), "rm geom");
          RSS(ref_node_remove(ref_node, new_node), "rm node");
          continue;
        } else {
          RSS(ref_cavity_create(&ref_cavity), "cav create");
          if (ref_cavity_debug(ref_cavity)) printf("cavity debug start\n");
          RSS(ref_cavity_form_insert2(ref_cavity, ref_grid, new_node, node,
                                      REF_EMPTY, constraining_faceid),
              "ball");
          if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) {
            printf(" form state %d error\n", (int)ref_cavity_state(ref_cavity));
            ref_cavity_tec(ref_cavity, "cav-form.tec");
          }
          RSB(ref_cavity_enlarge_combined(ref_cavity), "enlarge", {
            ref_cavity_tec(ref_cavity, "cav-fail.tec");
            ref_export_by_extension(ref_grid, "mesh-fail.tec");
          });
          if (REF_CAVITY_VISIBLE != ref_cavity_state(ref_cavity)) {
            RSB(ref_cavity_form_insert2_unconstrain(ref_cavity,
                                                    constraining_faceid),
                "unconst", {
                  printf(" unconstrain state %d\n",
                         (int)ref_cavity_state(ref_cavity));
                  ref_cavity_tec(ref_cavity, "cav-unconst.tec");
                });
            RSB(ref_cavity_enlarge_combined(ref_cavity), "enlarge", {
              ref_cavity_tec(ref_cavity, "cav-fail.tec");
              ref_export_by_extension(ref_grid, "mesh-fail.tec");
            });
          }
          if (node == REF_EMPTY && /* turns off continue */
              REF_CAVITY_VISIBLE != ref_cavity_state(ref_cavity)) {
            RSS(ref_cavity_free(ref_cavity), "cav free");
            off_node[node] = REF_EMPTY;
            RSS(ref_geom_remove_all(ref_geom, new_node), "rm geom");
            RSS(ref_node_remove(ref_node, new_node), "rm node");
            continue;
          }
          RSB(ref_cavity_replace(ref_cavity), "cav replace", {
            ref_export_by_extension(ref_grid, "ref_layer_prism_replace.tec");
            ref_cavity_tec(ref_cavity, "ref_layer_prism_cavity.tec");
            ref_export_by_extension(ref_grid, "ref_layer_prism_mesh.tec");
          });
          if (ref_cavity_debug(ref_cavity)) printf("replace complete\n");
          RSS(ref_cavity_free(ref_cavity), "cav free");
        }
      } else {
        RSS(ref_cavity_create(&ref_cavity), "cav create");
        RSS(ref_cavity_form_insert_tet(ref_cavity, ref_grid, new_node, node,
                                       REF_EMPTY),
            "ball");
        RSB(ref_cavity_enlarge_combined(ref_cavity), "enlarge", {
          ref_cavity_tec(ref_cavity, "cav-fail.tec");
          ref_export_by_extension(ref_grid, "mesh-fail.tec");
        });
        RSB(ref_cavity_replace(ref_cavity), "cav replace", {
          ref_cavity_tec(ref_cavity, "ref_layer_prism_cavity.tec");
          ref_export_by_extension(ref_grid, "ref_layer_prism_mesh.tec");
        });
        RSS(ref_cavity_free(ref_cavity), "cav free");
      }
    }
  }
  return REF_SUCCESS;
}